

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<QString>::appendIteratorRange<QHash<QString,QString>::key_iterator>
          (QCommonArrayOps<QString> *this,key_iterator b,key_iterator e,
          IfIsForwardIterator<QHash<QString,_QString>::key_iterator> param_3)

{
  Entry *pEVar1;
  Data *pDVar2;
  QString *pQVar3;
  ulong uVar4;
  ulong uVar5;
  Data<QHashPrivate::Node<QString,_QString>_> *pDVar6;
  long lVar7;
  
  uVar4 = b.i.i.bucket;
  pDVar6 = b.i.i.d;
  if (uVar4 != e.i.i.bucket || pDVar6 != e.i.i.d) {
    lVar7 = (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.size
    ;
    pQVar3 = (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.ptr
             + lVar7;
    do {
      pEVar1 = pDVar6->spans[uVar4 >> 7].entries;
      uVar5 = (ulong)((uint)pDVar6->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] * 0x30);
      pDVar2 = *(Data **)((pEVar1->storage).data + uVar5);
      (pQVar3->d).d = pDVar2;
      (pQVar3->d).ptr = *(char16_t **)((pEVar1->storage).data + uVar5 + 8);
      (pQVar3->d).size = *(qsizetype *)((pEVar1->storage).data + uVar5 + 0x10);
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        lVar7 = (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.
                size;
      }
      lVar7 = lVar7 + 1;
      (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.size =
           lVar7;
      pQVar3 = pQVar3 + 1;
      do {
        if (pDVar6->numBuckets - 1 == uVar4) {
          pDVar6 = (Data<QHashPrivate::Node<QString,_QString>_> *)0x0;
          uVar4 = 0;
          break;
        }
        uVar4 = uVar4 + 1;
      } while (pDVar6->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
    } while (uVar4 != e.i.i.bucket || pDVar6 != e.i.i.d);
  }
  return;
}

Assistant:

bool operator==(iterator other) const noexcept
    { return d == other.d && bucket == other.bucket; }